

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewAppendableFile
          (PosixEnv *this,string *filename,WritableFile **result)

{
  long lVar1;
  int iVar2;
  char *__file;
  _func_int **pp_Var3;
  PosixWritableFile *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RDI;
  long in_FS_OFFSET;
  int fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string *context;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  context = in_RDI;
  __file = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_ffffffffffffff78);
  iVar2 = open(__file,0x80441,0x1a4);
  if (iVar2 < 0) {
    ((_Alloc_hider *)&in_RCX->super_WritableFile)->_M_p = (pointer)0x0;
    __errno_location();
    PosixError(context,(int)((ulong)in_RDX >> 0x20));
  }
  else {
    pp_Var3 = (_func_int **)operator_new(0x10058);
    std::__cxx11::string::string
              (in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
    PosixWritableFile::PosixWritableFile
              (in_RCX,(string *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac)
    ;
    (in_RCX->super_WritableFile)._vptr_WritableFile = pp_Var3;
    std::__cxx11::string::~string(in_stack_ffffffffffffff78);
    Status::OK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status NewAppendableFile(const std::string& filename,
                           WritableFile** result) override {
    int fd = ::open(filename.c_str(),
                    O_APPEND | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixWritableFile(filename, fd);
    return Status::OK();
  }